

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O2

void stressing_multi_threads(int threadNum)

{
  ostream *poVar1;
  Thread *this;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  string local_a8;
  __shared_ptr<Thread,(__gnu_cxx::_Lock_policy)2> local_88 [8];
  shared_ptr<Thread> tmp;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> vsp;
  code *local_58 [2];
  code *local_48;
  code *local_40;
  uint local_38;
  allocator local_31;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"----------stressing test multi thread-----------")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = 0;
  if (0 < threadNum) {
    local_38 = threadNum;
  }
  uVar3 = local_38;
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    this = (Thread *)operator_new(200);
    local_58[1] = (code *)0x0;
    local_58[0] = threadFunc;
    local_40 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
    local_48 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
    std::__cxx11::string::string((string *)&local_a8,"testFunc",&local_31);
    Thread::Thread(this,(ThreadFunc *)local_58,&local_a8);
    std::__shared_ptr<Thread,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Thread,void>(local_88,this);
    std::__cxx11::string::~string((string *)&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)local_58);
    std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::push_back
              ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)
               &tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (value_type *)local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmp);
  }
  uVar2 = (ulong)local_38;
  for (lVar4 = 0; uVar2 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
    Thread::start(*(Thread **)
                   ((long)&(tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + lVar4));
  }
  sleep(3);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::~vector
            ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)
             &tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void stressing_multi_threads(int threadNum = 4)
{
    // threadNum * 100000 lines
    cout << "----------stressing test multi thread-----------" << endl;
    vector<shared_ptr<Thread>> vsp;
    for (int i = 0; i < threadNum; ++i)
    {
        shared_ptr<Thread> tmp(new Thread(threadFunc, "testFunc"));
        vsp.push_back(tmp);
    }
    for (int i = 0; i < threadNum; ++i)
    {
        vsp[i]->start();
    }
    sleep(3);
}